

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall gvr::PLYReader::printHeader(PLYReader *this)

{
  pointer ppPVar1;
  PLYElement *this_00;
  pointer pPVar2;
  ostream *poVar3;
  int k;
  long lVar4;
  long lVar5;
  ulong uVar6;
  string local_50;
  
  for (uVar6 = 0;
      ppPVar1 = (this->list).
                super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->list).
                            super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3);
      uVar6 = uVar6 + 1) {
    this_00 = ppPVar1[uVar6];
    PLYElement::toString_abi_cxx11_(&local_50,this_00);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_50);
    if (0 < this_00->size) {
      lVar5 = 0;
      for (lVar4 = 0;
          pPVar2 = (this_00->list).
                   super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar4 < (int)((ulong)((long)(this_00->list).
                                      super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) >>
                       6); lVar4 = lVar4 + 1) {
        (anonymous_namespace)::PLYProperty::toString_abi_cxx11_
                  (&local_50,(PLYProperty *)((long)&pPVar2->enc + lVar5));
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_50);
        lVar5 = lVar5 + 0x40;
      }
    }
  }
  return;
}

Assistant:

void PLYReader::printHeader()
{
  for (size_t i=0; i<list.size(); i++)
  {
    PLYElement *element=list[i];

    std::cout << element->toString() << std::endl;

    if (element->getInstances() > 0)
    {
      // write properties

      for (int k=0; k<element->getPropertyCount(); k++)
      {
        std::cout << element->getProperty(k).toString() << std::endl;
      }
    }
  }
}